

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_handler.cc
# Opt level: O1

void __thiscall
helix::nasdaq::nordic_itch_handler::process_msg(nordic_itch_handler *this,itch_order_cancel *m)

{
  ulong uVar1;
  order_book *this_00;
  _Hash_node_base *p_Var2;
  undefined8 uVar3;
  _Hash_node_base *order_id;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  uint64_t uVar7;
  itch_order_cancel *piVar8;
  __node_base_ptr p_Var9;
  __node_base_ptr p_Var10;
  event local_50;
  
  lVar4 = 1;
  do {
    if (m->OrderReferenceNumber[lVar4 + -1] != ' ') {
      pcVar5 = m->OrderReferenceNumber + lVar4 + -1;
      break;
    }
    lVar4 = lVar4 + 1;
    pcVar5 = m->CanceledQuantity;
  } while (lVar4 != 10);
  order_id = (_Hash_node_base *)0x0;
  for (; pcVar5 != m->CanceledQuantity; pcVar5 = pcVar5 + 1) {
    order_id = (_Hash_node_base *)(((long)*pcVar5 + (long)order_id * 10) - 0x30);
  }
  uVar1 = (this->order_id_map)._M_h._M_bucket_count;
  uVar6 = (ulong)order_id % uVar1;
  p_Var9 = (this->order_id_map)._M_h._M_buckets[uVar6];
  p_Var10 = (__node_base_ptr)0x0;
  if ((p_Var9 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var9->_M_nxt, p_Var10 = p_Var9, order_id != p_Var9->_M_nxt[1]._M_nxt)) {
    while (p_Var9 = p_Var2, p_Var2 = p_Var9->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var10 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar6) ||
         (p_Var10 = p_Var9, order_id == p_Var2[1]._M_nxt)) goto LAB_00118050;
    }
    p_Var10 = (__node_base_ptr)0x0;
  }
LAB_00118050:
  if (p_Var10 == (__node_base_ptr)0x0) {
    p_Var2 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var2 = p_Var10->_M_nxt;
  }
  if (p_Var2 != (_Hash_node_base *)0x0) {
    lVar4 = 0;
    do {
      if (m->CanceledQuantity[lVar4] != ' ') {
        piVar8 = (itch_order_cancel *)(m->CanceledQuantity + lVar4);
        break;
      }
      lVar4 = lVar4 + 1;
      piVar8 = m + 1;
    } while (lVar4 != 9);
    uVar7 = 0;
    for (; piVar8 != m + 1; piVar8 = (itch_order_cancel *)piVar8->OrderReferenceNumber) {
      uVar7 = ((long)piVar8->MsgType + uVar7 * 10) - 0x30;
    }
    this_00 = (order_book *)p_Var2[2]._M_nxt;
    order_book::cancel(this_00,(uint64_t)order_id,uVar7);
    uVar7 = this->time_sec * 1000 + this->time_msec;
    this_00->_timestamp = uVar7;
    make_ob_event(&local_50,(string *)this_00,uVar7,this_00,0);
    if ((this->_process_event).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar3 = std::__throw_bad_function_call();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._symbol._M_dataplus._M_p != &local_50._symbol.field_2) {
        operator_delete(local_50._symbol._M_dataplus._M_p,
                        local_50._symbol.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar3);
    }
    (*(this->_process_event)._M_invoker)((_Any_data *)&this->_process_event,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._symbol._M_dataplus._M_p != &local_50._symbol.field_2) {
      operator_delete(local_50._symbol._M_dataplus._M_p,
                      local_50._symbol.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void nordic_itch_handler::process_msg(const itch_order_cancel* m)
{
    uint64_t order_id = itch_uatoi(m->OrderReferenceNumber, sizeof(m->OrderReferenceNumber));
    auto it = order_id_map.find(order_id);
    if (it != order_id_map.end()) {
        uint64_t quantity = itch_uatoi(m->CanceledQuantity, sizeof(m->CanceledQuantity));
        auto& ob = it->second;
        ob.cancel(order_id, quantity);
        ob.set_timestamp(timestamp());
        _process_event(make_ob_event(ob.symbol(), timestamp(), &ob));
    }
}